

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O0

bool __thiscall QFSFileEnginePrivate::nativeSyncToDisk(QFSFileEnginePrivate *this)

{
  long lVar1;
  int iVar2;
  QString *errorString;
  int *piVar3;
  QFSFileEnginePrivate *in_RDI;
  long in_FS_OFFSET;
  int ret;
  QFSFileEngine *q;
  QFSFileEnginePrivate *in_stack_ffffffffffffffb0;
  FileError in_stack_ffffffffffffffbc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  errorString = (QString *)q_func(in_RDI);
  do {
    iVar2 = nativeHandle(in_stack_ffffffffffffffb0);
    iVar2 = fdatasync(iVar2);
    in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc & 0xffffff;
    if (iVar2 == -1) {
      piVar3 = __errno_location();
      in_stack_ffffffffffffffbc = CONCAT13(*piVar3 == 4,(int3)in_stack_ffffffffffffffbc);
    }
  } while ((char)(in_stack_ffffffffffffffbc >> 0x18) != '\0');
  if (iVar2 != 0) {
    __errno_location();
    qt_error_string(in_stack_ffffffffffffffbc);
    QAbstractFileEngine::setError
              ((QAbstractFileEngine *)in_RDI,in_stack_ffffffffffffffbc,errorString);
    QString::~QString((QString *)0x18c800);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2 == 0;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEnginePrivate::nativeSyncToDisk()
{
    Q_Q(QFSFileEngine);
    int ret;
#if defined(_POSIX_SYNCHRONIZED_IO) && _POSIX_SYNCHRONIZED_IO > 0
    QT_EINTR_LOOP(ret, fdatasync(nativeHandle()));
#else
    QT_EINTR_LOOP(ret, fsync(nativeHandle()));
#endif
    if (ret != 0)
        q->setError(QFile::WriteError, qt_error_string(errno));
    return ret == 0;
}